

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImageChannel.h
# Opt level: O3

void __thiscall
Imf_3_4::TypedFlatImageChannel<Imath_3_2::half>::resetBasePointer
          (TypedFlatImageChannel<Imath_3_2::half> *this)

{
  ImageLevel *pIVar1;
  
  pIVar1 = (this->super_FlatImageChannel).super_ImageChannel._level;
  this->_base = this->_pixels +
                (-((long)((pIVar1->_dataWindow).min.y /
                         (this->super_FlatImageChannel).super_ImageChannel._ySampling) *
                  (long)(this->super_FlatImageChannel).super_ImageChannel._pixelsPerRow) -
                (long)((pIVar1->_dataWindow).min.x /
                      (this->super_FlatImageChannel).super_ImageChannel._xSampling));
  return;
}

Assistant:

ImageLevel&       level () { return _level; }